

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuantizationValidationUtils.cpp
# Opt level: O0

bool CoreML::hasValidQuantizationParams(WeightParams *weight,int expectSize)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QuantizationParams *this;
  uint64_t uVar4;
  LinearQuantizationParams *pLVar5;
  LookUpTableQuantizationParams *this_00;
  int tableLength;
  int biasLength;
  int scaleLength;
  uint64_t nbits;
  QuantizationParams *quant;
  int expectSize_local;
  WeightParams *weight_local;
  
  bVar1 = Specification::WeightParams::has_quantization(weight);
  if (bVar1) {
    this = Specification::WeightParams::quantization(weight);
    uVar4 = Specification::QuantizationParams::numberofbits(this);
    if ((uVar4 == 0) || (8 < uVar4)) {
      weight_local._7_1_ = false;
    }
    else {
      bVar1 = Specification::QuantizationParams::has_linearquantization(this);
      if (bVar1) {
        pLVar5 = Specification::QuantizationParams::linearquantization(this);
        iVar3 = Specification::LinearQuantizationParams::scale_size(pLVar5);
        if ((iVar3 != 1) && (iVar3 != expectSize)) {
          return false;
        }
        pLVar5 = Specification::QuantizationParams::linearquantization(this);
        iVar2 = Specification::LinearQuantizationParams::bias_size(pLVar5);
        if ((iVar2 != 0) && (iVar2 != iVar3)) {
          return false;
        }
      }
      else {
        bVar1 = Specification::QuantizationParams::has_lookuptablequantization(this);
        if (!bVar1) {
          return false;
        }
        this_00 = Specification::QuantizationParams::lookuptablequantization(this);
        iVar3 = Specification::LookUpTableQuantizationParams::floatvalue_size(this_00);
        if (iVar3 != 2 << ((char)uVar4 - 1U & 0x1f)) {
          return false;
        }
      }
      weight_local._7_1_ = true;
    }
  }
  else {
    weight_local._7_1_ = false;
  }
  return weight_local._7_1_;
}

Assistant:

bool hasValidQuantizationParams(const CoreML::Specification::WeightParams& weight,
                                    const int expectSize){
        if (!weight.has_quantization()){
            return false;
        }
        const CoreML::Specification::QuantizationParams& quant = weight.quantization();
        const uint64_t nbits = quant.numberofbits();
        if (!(nbits >= 1 && nbits <= 8)){
            return false;
        }
        if (quant.has_linearquantization()){
            // Acceptable linear quantization cases:
            // scale can be vector of size 1 or expectSize (output channels in most cases)
            // bias can be nothing, or having the same length as scale
            int scaleLength = quant.linearquantization().scale_size();
            if (!(scaleLength == 1 || scaleLength == expectSize)){
                return false;
            }
            int biasLength = quant.linearquantization().bias_size();
            if (!(biasLength == 0 || biasLength == scaleLength)){
                return false;
            }
        } else if (quant.has_lookuptablequantization()){
            int tableLength = quant.lookuptablequantization().floatvalue_size();
            if (tableLength != 2 << (nbits-1)){
                return false;
            }
        } else { // invalid type
            return false;
        }
        return true;
    }